

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O1

void __thiscall
asmjit::v1_14::JitAllocatorBlock::markShrunkArea
          (JitAllocatorBlock *this,uint32_t shrunkAreaStart,uint32_t shrunkAreaEnd)

{
  ulong *puVar1;
  long *plVar2;
  uint uVar3;
  BitWord *pBVar4;
  byte bVar5;
  undefined8 uVar6;
  JitAllocatorPool *pJVar7;
  void *pvVar8;
  CpuInfo *pCVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined4 in_register_00000034;
  CreateParams *params;
  ulong *__s;
  uint uVar14;
  
  params = (CreateParams *)CONCAT44(in_register_00000034,shrunkAreaStart);
  if (shrunkAreaStart == 0) {
    markShrunkArea();
  }
  else {
    uVar14 = shrunkAreaEnd - shrunkAreaStart;
    uVar13 = (ulong)uVar14;
    if (uVar14 != 0) {
      uVar3 = this->_flags;
      plVar2 = (long *)((long)this->_pool->totalAreaUsed + (ulong)(uVar3 & 8));
      *plVar2 = *plVar2 - uVar13;
      this->_areaUsed = this->_areaUsed - uVar14;
      uVar14 = this->_searchStart;
      if (shrunkAreaStart <= this->_searchStart) {
        uVar14 = shrunkAreaStart;
      }
      uVar10 = this->_searchEnd;
      if (this->_searchEnd <= shrunkAreaEnd) {
        uVar10 = shrunkAreaEnd;
      }
      this->_searchStart = uVar14;
      this->_searchEnd = uVar10;
      pBVar4 = this->_usedBitVector;
      uVar12 = 0x40 - (ulong)(shrunkAreaStart & 0x3f);
      if (uVar13 <= uVar12) {
        uVar12 = uVar13;
      }
      puVar1 = pBVar4 + (shrunkAreaStart >> 6);
      __s = puVar1 + 1;
      *puVar1 = *puVar1 & ~((0xffffffffffffffffU >> (-(char)uVar12 & 0x3fU)) <<
                           (sbyte)(shrunkAreaStart & 0x3f));
      uVar11 = uVar13 - uVar12;
      if (0x3f < uVar11) {
        uVar12 = (uVar13 - uVar12) - 0x40;
        uVar13 = uVar12 >> 6;
        memset(__s,0,uVar13 * 8 + 8);
        uVar11 = (ulong)((uint)uVar12 & 0x3f);
        __s = pBVar4 + uVar13 + (shrunkAreaStart >> 6) + 2;
      }
      if (uVar11 != 0) {
        *__s = *__s & ~(0xffffffffffffffffU >> (-(char)uVar11 & 0x3fU));
      }
      pBVar4 = this->_stopBitVector;
      bVar5 = (byte)(shrunkAreaEnd - 1) & 0x3f;
      puVar1 = pBVar4 + (shrunkAreaEnd - 1 >> 6);
      *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      puVar1 = pBVar4 + (shrunkAreaStart - 1 >> 6);
      *puVar1 = *puVar1 | 1L << ((byte)(shrunkAreaStart - 1) & 0x3f);
      this->_flags = uVar3 | 4;
      return;
    }
  }
  markShrunkArea();
  Target::Target((Target *)this);
  *(undefined ***)this = &PTR__JitRuntime_00177338;
  JitAllocator::JitAllocator((JitAllocator *)&(this->_mapping).rw,params);
  *(undefined8 *)&this->field_0x8 = 0x203000002;
  this->field_0xd = 1;
  pCVar9 = CpuInfo::host();
  uVar6 = *(undefined8 *)(pCVar9 + 0x80);
  pJVar7 = *(JitAllocatorPool **)(pCVar9 + 0x88);
  pvVar8 = *(void **)(pCVar9 + 0x90);
  *(undefined8 *)&this->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock> =
       *(undefined8 *)(pCVar9 + 0x78);
  *(undefined8 *)&this->field_0x18 = uVar6;
  this->_pool = pJVar7;
  (this->_mapping).rx = pvVar8;
  return;
}

Assistant:

inline void markShrunkArea(uint32_t shrunkAreaStart, uint32_t shrunkAreaEnd) noexcept {
    uint32_t shrunkAreaSize = shrunkAreaEnd - shrunkAreaStart;

    // Shrunk area cannot start at zero as it would mean that we have shrunk the first
    // block to zero bytes, which is not allowed as such block must be released instead.
    ASMJIT_ASSERT(shrunkAreaStart != 0);
    ASMJIT_ASSERT(shrunkAreaSize != 0);

    // Update the search region and statistics.
    _pool->totalAreaUsed[size_t(hasLargePages())] -= shrunkAreaSize;
    _areaUsed -= shrunkAreaSize;
    _searchStart = Support::min(_searchStart, shrunkAreaStart);
    _searchEnd = Support::max(_searchEnd, shrunkAreaEnd);

    // Unmark the released space and move the sentinel.
    Support::bitVectorClear(_usedBitVector, shrunkAreaStart, shrunkAreaSize);
    Support::bitVectorSetBit(_stopBitVector, shrunkAreaEnd - 1, false);
    Support::bitVectorSetBit(_stopBitVector, shrunkAreaStart - 1, true);

    addFlags(kFlagDirty);
  }